

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O3

event_set *
afsm::detail::state_base_impl<afsm::test::ortho_sm_def::off,_false>::static_handled_events(void)

{
  if (state_base_impl<afsm::test::ortho_sm_def::off,false>::static_handled_events()::evts_ == '\0')
  {
    state_base_impl<afsm::test::ortho_sm_def::off,false>::static_handled_events();
  }
  return &static_handled_events::evts_;
}

Assistant:

static event_set const&
    static_handled_events()
    {
        static event_set evts_ = make_event_set(handled_events{});
        return evts_;
    }